

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool testing::internal::MatchPrintAndExplain<std::__cxx11::string_const,std::__cxx11::string_const&>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
               Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *matcher,MatchResultListener *listener)

{
  ostream **this;
  ostream *poVar1;
  bool bVar2;
  int iVar3;
  undefined1 local_1e8 [8];
  StringMatchResultListener inner_listener;
  long local_48;
  long local_40 [2];
  
  if (listener->stream_ == (ostream *)0x0) {
    inner_listener.super_MatchResultListener._vptr_MatchResultListener = (_func_int **)0x0;
    local_1e8 = (undefined1  [8])&PTR__MatchResultListener_002d10e0;
    bVar2 = MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            ::MatchAndExplain(&matcher->
                               super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                              ,value,(MatchResultListener *)local_1e8);
  }
  else {
    this = &inner_listener.super_MatchResultListener.stream_;
    inner_listener.super_MatchResultListener._vptr_MatchResultListener =
         (_func_int **)&inner_listener.field_0x18;
    local_1e8 = (undefined1  [8])&PTR__StringMatchResultListener_002d1120;
    std::__cxx11::stringstream::stringstream((stringstream *)this);
    bVar2 = MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            ::MatchAndExplain(&matcher->
                               super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                              ,value,(MatchResultListener *)local_1e8);
    PrintStringTo(value,listener->stream_);
    std::__cxx11::stringbuf::str();
    poVar1 = listener->stream_;
    iVar3 = std::__cxx11::string::compare(&inner_listener.field_0x190);
    if ((poVar1 != (ostream *)0x0) && (iVar3 != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,(char *)inner_listener._400_8_,local_48);
    }
    if ((long *)inner_listener._400_8_ != local_40) {
      operator_delete((void *)inner_listener._400_8_,local_40[0] + 1);
    }
    local_1e8 = (undefined1  [8])&PTR__StringMatchResultListener_002d1120;
    std::__cxx11::stringstream::~stringstream((stringstream *)this);
    std::ios_base::~ios_base((ios_base *)&inner_listener.field_0x88);
  }
  return bVar2;
}

Assistant:

bool MatchPrintAndExplain(Value& value, const Matcher<T>& matcher,
                          MatchResultListener* listener) {
  if (!listener->IsInterested()) {
    // If the listener is not interested, we do not need to construct the
    // inner explanation.
    return matcher.Matches(value);
  }

  StringMatchResultListener inner_listener;
  const bool match = matcher.MatchAndExplain(value, &inner_listener);

  UniversalPrint(value, listener->stream());
#if GTEST_HAS_RTTI
  const std::string& type_name = GetTypeName<Value>();
  if (IsReadableTypeName(type_name))
    *listener->stream() << " (of type " << type_name << ")";
#endif
  PrintIfNotEmpty(inner_listener.str(), listener->stream());

  return match;
}